

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O2

bool is_sort(int *arr,int len,Order type)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)len;
  if (type == DESC) {
    lVar5 = 1;
    do {
      bVar3 = lVar4 <= lVar5;
      if (lVar4 <= lVar5) {
        return bVar3;
      }
      lVar2 = lVar5 + -1;
      piVar1 = arr + lVar5;
      lVar5 = lVar5 + 1;
    } while (*piVar1 <= arr[lVar2]);
  }
  else {
    lVar5 = 1;
    do {
      bVar3 = lVar4 <= lVar5;
      if (lVar4 <= lVar5) {
        return bVar3;
      }
      lVar2 = lVar5 + -1;
      piVar1 = arr + lVar5;
      lVar5 = lVar5 + 1;
    } while (arr[lVar2] <= *piVar1);
  }
  return bVar3;
}

Assistant:

bool is_sort(int* arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}